

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarCommon.h
# Opt level: O2

float ZXing::OneD::DataBar::ModSizeFinder(PatternView *view)

{
  int iVar1;
  PatternView local_20;
  
  local_20._data = view->_data + 8;
  local_20._size = 5;
  local_20._base = view->_base;
  local_20._end = view->_end;
  iVar1 = PatternView::sum(&local_20,0);
  return (float)iVar1 / 15.0;
}

Assistant:

inline float ModSizeFinder(const PatternView& view)
{
	return Finder(view).sum() / 15.f;
}